

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_micro.c
# Opt level: O0

VMEMcache *
bench_init(char *path,size_t size,size_t extent_size,vmemcache_repl_p repl_p,uint n_threads,
          context *ctx)

{
  FILE *__stream;
  int iVar1;
  VMEMcache *pVVar2;
  undefined8 uVar3;
  uint local_3c;
  uint i;
  VMEMcache *cache;
  context *ctx_local;
  uint n_threads_local;
  vmemcache_repl_p repl_p_local;
  size_t extent_size_local;
  size_t size_local;
  char *path_local;
  
  pVVar2 = (VMEMcache *)vmemcache_new();
  vmemcache_set_size(pVVar2,size);
  vmemcache_set_eviction_policy(pVVar2,repl_p);
  iVar1 = vmemcache_add(pVVar2,path);
  if (iVar1 != 0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_micro.c"
            ,0x35,"bench_init");
    __stream = _stderr;
    uVar3 = vmemcache_errormsg();
    fprintf(__stream,"vmemcache_add: %s (%s)",uVar3,path);
    fprintf(_stderr,"\n");
    abort();
  }
  for (local_3c = 0; local_3c < n_threads; local_3c = local_3c + 1) {
    ctx[local_3c].cache = pVVar2;
    ctx[local_3c].secs = 0.0;
  }
  return pVVar2;
}

Assistant:

static VMEMcache *
bench_init(const char *path, size_t size, size_t extent_size,
		enum vmemcache_repl_p repl_p,
		unsigned n_threads, struct context *ctx)
{
	VMEMcache *cache = vmemcache_new();
	vmemcache_set_size(cache, size);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, path))
		UT_FATAL("vmemcache_add: %s (%s)", vmemcache_errormsg(), path);

	for (unsigned i = 0; i < n_threads; ++i) {
		ctx[i].cache = cache;
		ctx[i].secs = 0.0;
	}

	return cache;
}